

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yprp_stmt(lys_ypr_ctx_conflict *pctx,lysp_stmt *stmt)

{
  uint16_t *puVar1;
  byte bVar2;
  char *pcVar3;
  char *attr_name;
  char *attr_value;
  byte flag;
  lysp_stmt *stmt_00;
  
  flag = -(stmt->child == (lysp_stmt *)0x0) | 1;
  pcVar3 = lys_stmt_str(stmt->kw);
  if (pcVar3 == (char *)0x0) {
    if (stmt->kw != LY_STMT_EXTENSION_INSTANCE) goto LAB_00196cda;
    pcVar3 = stmt->stmt;
    if ((stmt->arg == (char *)0x0) || (*stmt->arg == '\0')) {
      attr_name = (char *)0x0;
    }
    else {
      attr_name = lys_stmt_arg(LY_STMT_VALUE);
    }
    attr_value = stmt->arg;
  }
  else {
    bVar2 = lys_stmt_flags(stmt->kw);
    pcVar3 = stmt->stmt;
    if ((bVar2 & 1) != 0) {
      ypr_open(pctx,pcVar3,(char *)0x0,(char *)0x0,flag);
      pcVar3 = lys_stmt_arg(stmt->kw);
      ypr_yin_arg(pctx,pcVar3,stmt->arg);
      goto LAB_00196cda;
    }
    attr_name = lys_stmt_arg(stmt->kw);
    attr_value = stmt->arg;
  }
  ypr_open(pctx,pcVar3,attr_name,attr_value,flag);
LAB_00196cda:
  if (stmt->child != (lysp_stmt *)0x0) {
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    for (stmt_00 = stmt->child; stmt_00 != (lysp_stmt *)0x0; stmt_00 = stmt_00->next) {
      yprp_stmt(pctx,stmt_00);
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    ypr_close(pctx,stmt->stmt,flag);
    return;
  }
  return;
}

Assistant:

static void
yprp_stmt(struct lys_ypr_ctx *pctx, struct lysp_stmt *stmt)
{
    struct lysp_stmt *childstmt;
    int8_t flag = stmt->child ? 1 : -1;

    if (lys_stmt_str(stmt->kw)) {
        if (lys_stmt_flags(stmt->kw) & LY_STMT_FLAG_YIN) {
            ypr_open(pctx, stmt->stmt, NULL, NULL, flag);
            ypr_yin_arg(pctx, lys_stmt_arg(stmt->kw), stmt->arg);
        } else {
            ypr_open(pctx, stmt->stmt, lys_stmt_arg(stmt->kw), stmt->arg, flag);
        }
    } else if (stmt->kw == LY_STMT_EXTENSION_INSTANCE) {
        ypr_open(pctx, stmt->stmt, (stmt->arg && stmt->arg[0]) ? lys_stmt_arg(LY_STMT_VALUE) : NULL, stmt->arg, flag);
    }

    if (stmt->child) {
        LEVEL++;
        LY_LIST_FOR(stmt->child, childstmt) {
            yprp_stmt(pctx, childstmt);
        }
        LEVEL--;
        ypr_close(pctx, stmt->stmt, flag);
    }
}